

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O0

RecyclerWeakReference<Js::RecyclableObject> * __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
::Insert(WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
         *this,RecyclableObject *key,bool value,bool add,bool checkForExisting)

{
  byte bVar1;
  int iVar2;
  int **ppiVar3;
  WeakRefDictionaryEntry<Js::RecyclableObject,_bool> **ppWVar4;
  RecyclerWeakReference<Js::RecyclableObject> **ppRVar5;
  RecyclerWeakReference<Js::RecyclableObject> *pRVar6;
  RecyclerWeakReference<Js::RecyclableObject> *weakRef;
  int local_30;
  int i;
  int previous;
  uint bucket;
  hash_t hash;
  bool checkForExisting_local;
  bool add_local;
  bool value_local;
  RecyclableObject *key_local;
  WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
  *this_local;
  
  bucket._1_1_ = checkForExisting;
  bucket._2_1_ = add;
  bucket._3_1_ = value;
  _hash = key;
  key_local = (RecyclableObject *)this;
  ppiVar3 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&this->buckets);
  if (*ppiVar3 == (int *)0x0) {
    Initialize(this,0);
  }
  previous = GetHashCode<Js::RecyclableObject>(this,_hash);
  i = PrimePolicy::GetBucket(previous,this->size,this->modFunctionIndex);
  if ((bucket._1_1_ & 1) != 0) {
    local_30 = -1;
    iVar2 = FindEntry<Js::RecyclableObject>(this,_hash,previous,(uint *)&i,&local_30);
    bVar1 = bucket._3_1_;
    if (iVar2 != -1) {
      if ((bucket._2_1_ & 1) == 0) {
        ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                            ((WriteBarrierPtr *)&this->entries);
        (*ppWVar4)[iVar2].value = (bool)(bVar1 & 1);
        this->version = this->version + 1;
        ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                            ((WriteBarrierPtr *)&this->entries);
        ppRVar5 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                            ((WriteBarrierPtr *)&(*ppWVar4)[iVar2].key);
        return *ppRVar5;
      }
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
  }
  pRVar6 = Memory::Recycler::CreateWeakReferenceHandle<Js::RecyclableObject>(this->recycler,_hash);
  pRVar6 = Insert(this,pRVar6,(bool)(bucket._3_1_ & 1),previous,i);
  return pRVar6;
}

Assistant:

const RecyclerWeakReference<TKey>* Insert(TKey* key, TValue value, bool add, bool checkForExisting = true)
        {
            if (buckets == nullptr) Initialize(0);

            hash_t hash = GetHashCode(key);
            uint bucket = PrimePolicy::GetBucket(hash, size, modFunctionIndex);

            if (checkForExisting)
            {
                int previous = -1;
                int i = FindEntry(key, hash, bucket, previous);

                if (i != -1)
                {
                    if (add)
                    {
                        Js::Throw::FatalInternalError();
                    }

                    entries[i].value = value;
                    version++;
                    return entries[i].key;
                }
            }

            // We know we need to insert- so first try creating the weak reference, before adding it to
            // the dictionary. If we OOM here, we still leave the dictionary as we found it.
            const RecyclerWeakReference<TKey>* weakRef = recycler->CreateWeakReferenceHandle<TKey>(key);

            return Insert(weakRef, value, hash, bucket);
        }